

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,uchar *memory,char **err)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  byte *pbVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  void *pvVar9;
  char *pcVar10;
  reference pvVar11;
  size_type sVar12;
  reference pvVar13;
  undefined8 *puVar14;
  undefined8 *in_RDX;
  int *in_RSI;
  long in_RDI;
  int i;
  int c_2;
  int c_1;
  int c;
  int dataHeight;
  int dataWidth;
  EXRAttribute attrib;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> customAttribs;
  int numCustomAttributes;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  uchar lineOrder;
  float pixelAspectRatio;
  float screenWindowWidth;
  float screenWindowCenter [2];
  int displayWindow [4];
  int numChannels;
  int dh;
  int dw;
  int dy;
  int dx;
  char header [4];
  char *marker;
  char *buf;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdb0;
  value_type *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  string local_e8 [32];
  string local_c8 [32];
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> local_a8;
  int local_8c;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_88;
  byte local_69;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58 [10];
  int *local_30;
  undefined8 *local_20;
  long local_10;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == (int *)0x0)) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_4 = -1;
  }
  else {
    local_58[9] = 0x1312f76;
    if (*in_RSI == 0x1312f76) {
      if (((((char)in_RSI[1] == '\x02') && (*(char *)((long)in_RSI + 5) == '\0')) &&
          (*(char *)((long)in_RSI + 6) == '\0')) && (*(char *)((long)in_RSI + 7) == '\0')) {
        local_30 = in_RSI + 2;
        local_58[8] = -1;
        local_58[7] = -1;
        local_58[6] = -1;
        local_58[5] = -1;
        local_58[4] = -1;
        local_58[0] = 0xffffffff;
        local_58[1] = 0xffffffff;
        local_58[2] = 0xffffffff;
        local_58[3] = 0xffffffff;
        local_20 = in_RDX;
        local_10 = in_RDI;
        memset(&local_60,0,8);
        local_64 = 0x3f800000;
        local_68 = 0x3f800000;
        local_69 = 0;
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)0x290795);
        local_8c = 0;
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)0x2907ad);
        do {
          std::__cxx11::string::string(local_c8);
          std::__cxx11::string::string(local_e8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2907ec);
          piVar4 = (int *)anon_unknown.dwarf_14dc25::ReadAttribute
                                    ((string *)
                                     CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                                     in_stack_fffffffffffffdc0,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
          if (piVar4 == (int *)0x0) {
            local_118 = 2;
            local_30 = (int *)((long)local_30 + 1);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_c8);
            if (iVar2 == 0) {
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&local_100,0);
              if (4 < *pbVar5) {
                if (local_20 != (undefined8 *)0x0) {
                  *local_20 = "Unsupported compression type.";
                }
                local_4 = -5;
                local_118 = 1;
                goto LAB_00290f4f;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_c8);
              if (iVar2 == 0) {
                anon_unknown.dwarf_14dc25::ReadChannelInfo
                          ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe08);
                sVar12 = std::
                         vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         ::size(&local_88);
                local_58[4] = (uint)sVar12;
                if ((int)local_58[4] < 1) {
                  if (local_20 != (undefined8 *)0x0) {
                    *local_20 = "Invalid channels format.";
                  }
                  local_4 = -6;
                  local_118 = 1;
                  goto LAB_00290f4f;
                }
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)local_c8);
                if (iVar2 == 0) {
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_58[8] = *piVar6;
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_58[7] = *piVar6;
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_58[6] = *piVar6;
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (in_stack_fffffffffffffdb0,
                                             CONCAT44(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8));
                  local_58[5] = *piVar6;
                  bVar1 = anon_unknown.dwarf_14dc25::IsBigEndian();
                  if (bVar1) {
                    anon_unknown.dwarf_14dc25::swap4(local_58 + 8);
                    anon_unknown.dwarf_14dc25::swap4(local_58 + 7);
                    anon_unknown.dwarf_14dc25::swap4(local_58 + 6);
                    anon_unknown.dwarf_14dc25::swap4(local_58 + 5);
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)local_c8);
                  if (iVar2 == 0) {
                    puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (in_stack_fffffffffffffdb0,
                                                CONCAT44(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8));
                    local_58[0] = *puVar7;
                    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_58[1] = *(undefined4 *)pvVar8;
                    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_58[2] = *(undefined4 *)pvVar8;
                    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                    local_58[3] = *(undefined4 *)pvVar8;
                    bVar1 = anon_unknown.dwarf_14dc25::IsBigEndian();
                    if (bVar1) {
                      anon_unknown.dwarf_14dc25::swap4(local_58);
                      anon_unknown.dwarf_14dc25::swap4(local_58 + 1);
                      anon_unknown.dwarf_14dc25::swap4(local_58 + 2);
                      anon_unknown.dwarf_14dc25::swap4(local_58 + 3);
                    }
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)local_c8);
                    if (iVar2 == 0) {
                      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         (in_stack_fffffffffffffdb0,
                                          CONCAT44(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8));
                      local_69 = *pbVar5;
                      in_stack_fffffffffffffe17 = anon_unknown.dwarf_14dc25::IsBigEndian();
                      if ((bool)in_stack_fffffffffffffe17) {
                        anon_unknown.dwarf_14dc25::swap4((uint *)&local_69);
                      }
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)local_c8);
                      if (iVar2 == 0) {
                        in_stack_fffffffffffffe08 =
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (in_stack_fffffffffffffdb0,
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
                        local_68 = *(uint *)&(in_stack_fffffffffffffe08->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data._M_start;
                        bVar1 = anon_unknown.dwarf_14dc25::IsBigEndian();
                        if (bVar1) {
                          anon_unknown.dwarf_14dc25::swap4(&local_68);
                        }
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)local_c8);
                        if (iVar2 == 0) {
                          puVar7 = (uint *)std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                     (in_stack_fffffffffffffdb0,
                                                      CONCAT44(in_stack_fffffffffffffdac,
                                                               in_stack_fffffffffffffda8));
                          local_60 = *puVar7;
                          puVar7 = (uint *)std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                     (in_stack_fffffffffffffdb0,
                                                      CONCAT44(in_stack_fffffffffffffdac,
                                                               in_stack_fffffffffffffda8));
                          local_5c = *puVar7;
                          bVar1 = anon_unknown.dwarf_14dc25::IsBigEndian();
                          if (bVar1) {
                            anon_unknown.dwarf_14dc25::swap4(&local_60);
                            anon_unknown.dwarf_14dc25::swap4(&local_5c);
                          }
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)local_c8);
                          if (iVar2 == 0) {
                            puVar7 = (uint *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at(in_stack_fffffffffffffdb0,
                                                CONCAT44(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8));
                            local_64 = *puVar7;
                            in_stack_fffffffffffffdcf = anon_unknown.dwarf_14dc25::IsBigEndian();
                            if ((bool)in_stack_fffffffffffffdcf) {
                              anon_unknown.dwarf_14dc25::swap4(&local_64);
                            }
                          }
                          else if (local_8c < 0x80) {
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            strdup(pcVar10);
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            strdup(pcVar10);
                            in_stack_fffffffffffffdb0 = &local_100;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      (in_stack_fffffffffffffdb0);
                            sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size(in_stack_fffffffffffffdb0);
                            in_stack_fffffffffffffdb8 = (value_type *)malloc(sVar12);
                            in_stack_fffffffffffffdc0 =
                                 (string *)
                                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (in_stack_fffffffffffffdb0,
                                            CONCAT44(in_stack_fffffffffffffdac,
                                                     in_stack_fffffffffffffda8));
                            sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size(&local_100);
                            memcpy(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,sVar12);
                            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            local_118 = 0;
            local_30 = piVar4;
          }
LAB_00290f4f:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_e8);
          std::__cxx11::string::~string(local_c8);
          if (local_118 != 0) {
            if (local_118 == 2) {
              if ((int)local_58[8] < 0) {
                __assert_fail("dx >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x2b0c,
                              "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                             );
              }
              if ((int)local_58[7] < 0) {
                __assert_fail("dy >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x2b0d,
                              "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                             );
              }
              if ((int)local_58[6] < 0) {
                __assert_fail("dw >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x2b0e,
                              "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                             );
              }
              if ((int)local_58[5] < 0) {
                __assert_fail("dh >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x2b0f,
                              "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                             );
              }
              if ((int)local_58[4] < 1) {
                __assert_fail("numChannels >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x2b10,
                              "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                             );
              }
              iVar2 = local_58[6] - local_58[8];
              iVar3 = local_58[5] - local_58[7];
              pvVar9 = malloc((long)(int)local_58[4] << 3);
              *(void **)(local_10 + 0x1008) = pvVar9;
              for (local_144 = 0; local_144 < (int)local_58[4]; local_144 = local_144 + 1) {
                std::
                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ::operator[](&local_88,(long)local_144);
                pcVar10 = (char *)std::__cxx11::string::c_str();
                pcVar10 = strdup(pcVar10);
                *(char **)(*(long *)(local_10 + 0x1008) + (long)local_144 * 8) = pcVar10;
              }
              *(uint *)(local_10 + 0x1004) = local_58[4];
              *(int *)(local_10 + 0x1028) = iVar2 + 1;
              *(int *)(local_10 + 0x102c) = iVar3 + 1;
              *(uint *)(local_10 + 0x1030) = local_68;
              *(uint *)(local_10 + 0x1058) = local_60;
              *(uint *)(local_10 + 0x105c) = local_5c;
              *(uint *)(local_10 + 0x1060) = local_64;
              *(uint *)(local_10 + 0x1048) = local_58[0];
              *(uint *)(local_10 + 0x104c) = local_58[1];
              *(uint *)(local_10 + 0x1050) = local_58[2];
              *(uint *)(local_10 + 0x1054) = local_58[3];
              *(uint *)(local_10 + 0x1038) = local_58[8];
              *(uint *)(local_10 + 0x103c) = local_58[7];
              *(uint *)(local_10 + 0x1040) = local_58[6];
              *(uint *)(local_10 + 0x1044) = local_58[5];
              *(uint *)(local_10 + 0x1034) = (uint)local_69;
              pvVar9 = malloc((long)(int)local_58[4] << 2);
              *(void **)(local_10 + 0x1018) = pvVar9;
              for (local_148 = 0; local_148 < (int)local_58[4]; local_148 = local_148 + 1) {
                pvVar11 = std::
                          vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ::operator[](&local_88,(long)local_148);
                *(int *)(*(long *)(local_10 + 0x1018) + (long)local_148 * 4) = pvVar11->pixelType;
              }
              pvVar9 = malloc((long)(int)local_58[4] << 2);
              *(void **)(local_10 + 0x1020) = pvVar9;
              for (local_14c = 0; local_14c < (int)local_58[4]; local_14c = local_14c + 1) {
                pvVar11 = std::
                          vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ::operator[](&local_88,(long)local_14c);
                *(int *)(*(long *)(local_10 + 0x1020) + (long)local_14c * 4) = pvVar11->pixelType;
              }
              if (0 < local_8c) {
                sVar12 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size(&local_a8)
                ;
                if (0x7f < sVar12) {
                  __assert_fail("customAttribs.size() < TINYEXR_MAX_ATTRIBUTES",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                                ,0x2b3e,
                                "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                               );
                }
                *(int *)(local_10 + 0x1000) = local_8c;
                local_150 = 0;
                while (iVar2 = local_150,
                      sVar12 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                                         (&local_a8), iVar2 < (int)sVar12) {
                  pvVar13 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                                      (&local_a8,(long)local_150);
                  puVar14 = (undefined8 *)(local_10 + (long)local_150 * 0x20);
                  *puVar14 = pvVar13->name;
                  puVar14[1] = pvVar13->type;
                  puVar14[2] = *(undefined8 *)&pvVar13->size;
                  puVar14[3] = pvVar13->value;
                  local_150 = local_150 + 1;
                }
              }
              local_4 = 0;
            }
            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~vector
                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                       in_stack_fffffffffffffdc0);
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       *)in_stack_fffffffffffffdc0);
            return local_4;
          }
          in_stack_fffffffffffffdac = 0;
        } while( true );
      }
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = "Unsupported version or scanline.";
      }
      local_4 = -4;
    }
    else {
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = "Header mismatch.";
      }
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,
                                         const unsigned char *memory,
                                         const char **err) {
  if (exrImage == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numChannels = -1;
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme.
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  float pixelAspectRatio = 1.0f;
  unsigned char lineOrder = 0; // 0 -> increasing y; 1 -> decreasing
  std::vector<ChannelInfo> channels;

  int numCustomAttributes = 0;
  std::vector<EXRAttribute> customAttribs;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs, 3: ZIP or 4: PIZ
      if (data[0] > 4) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(lineOrder));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        customAttribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  {
    exrImage->channel_names =
        (const char **)malloc(sizeof(const char *) * numChannels);
    for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
      exrImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
      exrImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
    }
    exrImage->num_channels = numChannels;

    exrImage->width = dataWidth;
    exrImage->height = dataHeight;
    exrImage->pixel_aspect_ratio = pixelAspectRatio;
    exrImage->screen_window_center[0] = screenWindowCenter[0];
    exrImage->screen_window_center[1] = screenWindowCenter[1];
    exrImage->screen_window_width = screenWindowWidth;
    exrImage->display_window[0] = displayWindow[0];
    exrImage->display_window[1] = displayWindow[1];
    exrImage->display_window[2] = displayWindow[2];
    exrImage->display_window[3] = displayWindow[3];
    exrImage->data_window[0] = dx;
    exrImage->data_window[1] = dy;
    exrImage->data_window[2] = dw;
    exrImage->data_window[3] = dh;
    exrImage->line_order = lineOrder;

    exrImage->pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->pixel_types[c] = channels[c].pixelType;
    }

    // Initially fill with values of `pixel-types`
    exrImage->requested_pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->requested_pixel_types[c] = channels[c].pixelType;
    }
  }

  if (numCustomAttributes > 0) {
    assert(customAttribs.size() < TINYEXR_MAX_ATTRIBUTES);
    exrImage->num_custom_attributes = numCustomAttributes;

    for (int i = 0; i < (int)customAttribs.size(); i++) {
      exrImage->custom_attributes[i] = customAttribs[i];
    }
  } 

  return 0; // OK
}